

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O3

void __thiscall
btSoftColliders::CollideCL_SS::Process(CollideCL_SS *this,btDbvtNode *la,btDbvtNode *lb)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  btDbvtNode *pbVar5;
  btDbvtNode *pbVar6;
  btSoftBody *pbVar7;
  Joint **ptr;
  bool bVar8;
  uint uVar9;
  btTransform *wtrs0;
  btTransform *wtrs1;
  Joint *pJVar10;
  Joint **ppJVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  undefined8 *puVar15;
  Body *pBVar16;
  byte bVar17;
  float fVar18;
  btSoftClusterCollisionShape csb;
  btSoftClusterCollisionShape csa;
  sResults res;
  CJoint joint;
  btConvexInternalShape local_200;
  btDbvtNode *local_1b8;
  btConvexInternalShape local_1b0;
  btDbvtNode *local_168;
  sResults local_160;
  undefined1 local_128 [192];
  Cluster *pCStack_68;
  btRigidBody *local_60;
  btCollisionObject *pbStack_58;
  Cluster *pCStack_50;
  btScalar bStack_48;
  btScalar local_44;
  btScalar bStack_40;
  undefined8 uStack_3c;
  
  bVar17 = 0;
  pbVar5 = (la->field_2).childs[0];
  pbVar6 = (lb->field_2).childs[0];
  pbVar7 = this->bodies[0];
  if (((pbVar7 == this->bodies[1]) && ((pbVar7->m_clusterConnectivity).m_size != 0)) &&
     ((pbVar7->m_clusterConnectivity).m_data
      [(long)(int)pbVar6[7].volume.mx.m_floats[3] * (long)(pbVar7->m_clusters).m_size +
       (long)(int)pbVar5[7].volume.mx.m_floats[3]] != false)) {
    Process::count = Process::count + 1;
  }
  else {
    btConvexInternalShape::btConvexInternalShape(&local_1b0);
    local_1b0.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
         (_func_int **)&PTR__btConvexShape_002216d0;
    local_1b0.m_collisionMargin = 0.0;
    local_168 = pbVar5;
    btConvexInternalShape::btConvexInternalShape(&local_200);
    local_200.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
         (_func_int **)&PTR__btConvexShape_002216d0;
    local_200.m_collisionMargin = 0.0;
    local_1b8 = pbVar6;
    wtrs0 = btTransform::getIdentity();
    wtrs1 = btTransform::getIdentity();
    local_128._4_4_ =
         (float)((ulong)*(undefined8 *)&pbVar5[4].field_2 >> 0x20) -
         (float)((ulong)*(undefined8 *)&pbVar6[4].field_2 >> 0x20);
    local_128._0_4_ =
         (float)*(undefined8 *)&pbVar5[4].field_2 - (float)*(undefined8 *)&pbVar6[4].field_2;
    local_128._8_4_ =
         *(float *)((long)&pbVar5[4].field_2 + 8) - *(float *)((long)&pbVar6[4].field_2 + 8);
    local_128._12_4_ = 0.0;
    bVar8 = btGjkEpaSolver2::SignedDistance
                      (&local_1b0.super_btConvexShape,wtrs0,&local_200.super_btConvexShape,wtrs1,
                       (btVector3 *)local_128,&local_160);
    if (bVar8) {
      local_128._40_8_ = (btRigidBody *)0x0;
      local_128._48_8_ = (btCollisionObject *)0x0;
      local_128._24_8_ = (btCollisionObject *)0x0;
      local_128._32_8_ = (Cluster *)0x0;
      local_128._16_8_ = (btRigidBody *)0x0;
      local_128[0xb4] = false;
      local_128._0_16_ = ZEXT816(0x2213f0);
      bVar8 = ClusterBase::SolveContact
                        (&this->super_ClusterBase,&local_160,(Body)ZEXT824(pbVar5),
                         (Body)ZEXT824(pbVar6),(CJoint *)local_128);
      if (bVar8) {
        pJVar10 = (Joint *)btAlignedAllocInternal(0xf8,0x10);
        memset(pJVar10->m_bodies,0,0xf0);
        pJVar10->_vptr_Joint = (_func_int **)&PTR__Joint_002213f0;
        puVar15 = (undefined8 *)(local_128 + 8);
        pBVar16 = pJVar10->m_bodies;
        for (lVar12 = 0xf; lVar12 != 0; lVar12 = lVar12 + -1) {
          pBVar16->m_soft = (Cluster *)*puVar15;
          puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
          pBVar16 = (Body *)((long)pBVar16 + (ulong)bVar17 * -0x10 + 8);
        }
        (pJVar10->m_sdrift).m_floats[3] = (btScalar)local_128._128_4_;
        *(undefined8 *)(pJVar10->m_massmatrix).m_el[0].m_floats = local_128._132_8_;
        *(undefined8 *)((pJVar10->m_massmatrix).m_el[0].m_floats + 2) = local_128._140_8_;
        *(undefined8 *)(pJVar10->m_massmatrix).m_el[1].m_floats = local_128._148_8_;
        *(undefined8 *)((pJVar10->m_massmatrix).m_el[1].m_floats + 2) = local_128._156_8_;
        *(undefined8 *)(pJVar10->m_massmatrix).m_el[2].m_floats = local_128._164_8_;
        *(undefined8 *)((pJVar10->m_massmatrix).m_el[2].m_floats + 2) = local_128._172_8_;
        pJVar10->m_delete = local_128[0xb4];
        *(ulong *)((long)&pJVar10[1].m_bodies[1].m_rigid + 4) = CONCAT44(bStack_40,local_44);
        *(undefined8 *)((long)&pJVar10[1].m_bodies[1].m_collisionObject + 4) = uStack_3c;
        pJVar10[1].m_bodies[1].m_soft = pCStack_50;
        pJVar10[1].m_bodies[1].m_rigid = (btRigidBody *)CONCAT44(local_44,bStack_48);
        pJVar10[1].m_bodies[0].m_rigid = local_60;
        pJVar10[1].m_bodies[0].m_collisionObject = pbStack_58;
        pJVar10[1]._vptr_Joint = (_func_int **)local_128._184_8_;
        pJVar10[1].m_bodies[0].m_soft = pCStack_68;
        pbVar7 = this->bodies[0];
        uVar9 = (pbVar7->m_joints).m_size;
        if (uVar9 == (pbVar7->m_joints).m_capacity) {
          iVar14 = 1;
          if (uVar9 != 0) {
            iVar14 = uVar9 * 2;
          }
          if ((int)uVar9 < iVar14) {
            if (iVar14 == 0) {
              ppJVar11 = (Joint **)0x0;
            }
            else {
              ppJVar11 = (Joint **)btAlignedAllocInternal((long)iVar14 << 3,0x10);
              uVar9 = (pbVar7->m_joints).m_size;
            }
            if (0 < (int)uVar9) {
              uVar13 = 0;
              do {
                ppJVar11[uVar13] = (pbVar7->m_joints).m_data[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar9 != uVar13);
            }
            ptr = (pbVar7->m_joints).m_data;
            if ((ptr != (Joint **)0x0) && ((pbVar7->m_joints).m_ownsMemory == true)) {
              btAlignedFreeInternal(ptr);
              uVar9 = (pbVar7->m_joints).m_size;
            }
            (pbVar7->m_joints).m_ownsMemory = true;
            (pbVar7->m_joints).m_data = ppJVar11;
            (pbVar7->m_joints).m_capacity = iVar14;
          }
        }
        (pbVar7->m_joints).m_data[(int)uVar9] = pJVar10;
        (pbVar7->m_joints).m_size = uVar9 + 1;
        fVar18 = (this->bodies[0]->m_cfg).kSSHR_CL;
        fVar1 = (this->bodies[0]->m_cfg).kSS_SPLT_CL;
        fVar2 = (this->bodies[1]->m_cfg).kSSHR_CL;
        if (fVar18 <= fVar2) {
          fVar18 = fVar2;
        }
        fVar2 = (this->bodies[1]->m_cfg).kSS_SPLT_CL;
        uVar3 = pJVar10->m_erp;
        uVar4 = pJVar10->m_split;
        pJVar10->m_erp = (float)uVar3 * fVar18;
        pJVar10->m_split = (float)uVar4 * (fVar1 + fVar2) * 0.5;
      }
    }
    btConvexShape::~btConvexShape(&local_200.super_btConvexShape);
    btConvexShape::~btConvexShape(&local_1b0.super_btConvexShape);
  }
  return;
}

Assistant:

void		Process(const btDbvtNode* la,const btDbvtNode* lb)
		{
			btSoftBody::Cluster*		cla=(btSoftBody::Cluster*)la->data;
			btSoftBody::Cluster*		clb=(btSoftBody::Cluster*)lb->data;


			bool connected=false;
			if ((bodies[0]==bodies[1])&&(bodies[0]->m_clusterConnectivity.size()))
			{
				connected = bodies[0]->m_clusterConnectivity[cla->m_clusterIndex+bodies[0]->m_clusters.size()*clb->m_clusterIndex];
			}

			if (!connected)
			{
				btSoftClusterCollisionShape	csa(cla);
				btSoftClusterCollisionShape	csb(clb);
				btGjkEpaSolver2::sResults	res;		
				if(btGjkEpaSolver2::SignedDistance(	&csa,btTransform::getIdentity(),
					&csb,btTransform::getIdentity(),
					cla->m_com-clb->m_com,res))
				{
					btSoftBody::CJoint	joint;
					if(SolveContact(res,cla,clb,joint))
					{
						btSoftBody::CJoint*	pj=new(btAlignedAlloc(sizeof(btSoftBody::CJoint),16)) btSoftBody::CJoint();
						*pj=joint;bodies[0]->m_joints.push_back(pj);
						pj->m_erp	*=	btMax(bodies[0]->m_cfg.kSSHR_CL,bodies[1]->m_cfg.kSSHR_CL);
						pj->m_split	*=	(bodies[0]->m_cfg.kSS_SPLT_CL+bodies[1]->m_cfg.kSS_SPLT_CL)/2;
					}
				}
			} else
			{
				static int count=0;
				count++;
				//printf("count=%d\n",count);
				
			}
		}